

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.h
# Opt level: O1

void __thiscall
ccs::PropertySetting::PropertySetting(PropertySetting *this,Specificity spec,Property *value)

{
  _Rb_tree_header *p_Var1;
  Property *local_18;
  
  this->spec = spec;
  this->override = value->override_;
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_18 = value;
  std::
  _Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
  ::_M_insert_unique<ccs::Property_const*const&>
            ((_Rb_tree<ccs::Property_const*,ccs::Property_const*,std::_Identity<ccs::Property_const*>,std::less<ccs::Property_const*>,std::allocator<ccs::Property_const*>>
              *)&this->values,&local_18);
  return;
}

Assistant:

PropertySetting(Specificity spec, const Property *value)
    : spec(spec),
      override(value->override()) {
      values.insert(value);
    }